

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall InterpreterTestSuite_PC_Help_Test::TestBody(InterpreterTestSuite_PC_Help_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  char *message;
  char *in_R9;
  string local_280;
  AssertHelper local_260;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_;
  allocator local_1e9;
  string local_1e8;
  Expression local_1c8;
  undefined1 local_1b0 [8];
  Value value;
  Expression expr;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_Help_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"help",&local_1e9);
  ot::commissioner::Interpreter::ParseExpression(&local_1c8,(Interpreter *)local_140,&local_1e8);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,this_00)
  ;
  ot::commissioner::Interpreter::Value::operator=((Value *)local_1b0,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_249 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_1b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_280,(internal *)local_248,(AssertionResult *)0x46a487,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x87e,message);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Help)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("help");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}